

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

bool chaiscript::dispatch::detail::compare_types_cast<int,chaiscript::Boxed_Number_const&>
               (_func_int_Boxed_Number_ptr *param_1,Function_Params *params,
               Type_Conversions_State *t_conversions)

{
  Boxed_Value *bv;
  bad_boxed_cast *anon_var_0;
  Boxed_Number local_40;
  undefined8 local_30;
  size_type i;
  Type_Conversions_State *t_conversions_local;
  Function_Params *params_local;
  _func_int_Boxed_Number_ptr *param_0_local;
  
  local_30 = 1;
  i = (size_type)t_conversions;
  t_conversions_local = (Type_Conversions_State *)params;
  params_local = (Function_Params *)param_1;
  bv = Function_Params::operator[](params,0);
  boxed_cast<chaiscript::Boxed_Number_const&>
            ((chaiscript *)&local_40,bv,(Type_Conversions_State *)i);
  Boxed_Number::~Boxed_Number(&local_40);
  return true;
}

Assistant:

bool compare_types_cast(Ret (*)(Params...), const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) noexcept {
        try {
          std::vector<Boxed_Value>::size_type i = 0;
          (boxed_cast<Params>(params[i++], &t_conversions), ...);
          return true;
        } catch (const exception::bad_boxed_cast &) {
          return false;
        }
      }